

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O2

void proto2_unittest::TestJsonName::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  Nullable<const_char_*> failure_msg;
  TestJsonName *_this;
  TestJsonName *local_20;
  MessageLite *local_18 [2];
  
  local_20 = (TestJsonName *)to_msg;
  local_18[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<proto2_unittest::TestJsonName_const*,proto2_unittest::TestJsonName*>
                          ((TestJsonName **)local_18,&local_20,"&from != _this");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_18,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest.pb.cc"
               ,0xb0f6,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_18)
    ;
  }
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((uVar1 & 0x7f) != 0) {
    if ((uVar1 & 1) != 0) {
      *(int *)((long)&local_20->field_0 + 8) = (int)from_msg[1]._internal_metadata_.ptr_;
    }
    if ((uVar1 & 2) != 0) {
      (local_20->field_0)._impl_.fieldname2_ =
           *(int32_t *)((long)&from_msg[1]._internal_metadata_.ptr_ + 4);
    }
    if ((uVar1 & 4) != 0) {
      *(undefined4 *)((long)&local_20->field_0 + 0x10) =
           *(undefined4 *)&from_msg[2]._vptr_MessageLite;
    }
    if ((uVar1 & 8) != 0) {
      (local_20->field_0)._impl_._field_name4_ =
           *(int32_t *)((long)&from_msg[2]._vptr_MessageLite + 4);
    }
    if ((uVar1 & 0x10) != 0) {
      *(int *)((long)&local_20->field_0 + 0x18) = (int)from_msg[2]._internal_metadata_.ptr_;
    }
    if ((uVar1 & 0x20) != 0) {
      (local_20->field_0)._impl_.field_name6_ =
           *(int32_t *)((long)&from_msg[2]._internal_metadata_.ptr_ + 4);
    }
    if ((uVar1 & 0x40) != 0) {
      *(undefined4 *)((long)&local_20->field_0 + 0x20) =
           *(undefined4 *)&from_msg[3]._vptr_MessageLite;
    }
  }
  (local_20->field_0)._impl_._has_bits_.has_bits_[0] =
       (local_20->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(local_20->super_Message).super_MessageLite._internal_metadata_,
             &from_msg->_internal_metadata_);
  return;
}

Assistant:

void TestJsonName::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestJsonName*>(&to_msg);
  auto& from = static_cast<const TestJsonName&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestJsonName)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000007fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_impl_.field_name1_ = from._impl_.field_name1_;
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.fieldname2_ = from._impl_.fieldname2_;
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.fieldname3_ = from._impl_.fieldname3_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_._field_name4_ = from._impl_._field_name4_;
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.field_name5_ = from._impl_.field_name5_;
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.field_name6_ = from._impl_.field_name6_;
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      _this->_impl_.fieldname7_ = from._impl_.fieldname7_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}